

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateBlock(ExpressionEvalContext *ctx,ExprBlock *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  int iVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  ExprBase *pEVar8;
  undefined4 extraout_var_00;
  ExprBase *expression_00;
  bool bVar9;
  
  uVar1 = ctx->instruction;
  pEVar8 = (ExprBase *)(ulong)uVar1;
  if (uVar1 < ctx->instructionsLimit) {
    ctx->instruction = uVar1 + 1;
    uVar1 = (ctx->stackFrames).count;
    if (uVar1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    expression_00 = (expression->expressions).head;
    bVar9 = expression_00 == (ExprBase *)0x0;
    if (!bVar9) {
      pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
      pEVar8 = (ExprBase *)0x0;
      do {
        pEVar7 = Evaluate(ctx,expression_00);
        if (pEVar7 == (ExprBase *)0x0) break;
        if (((pSVar2->continueDepth != 0) || (pSVar2->breakDepth != 0)) ||
           (pSVar2->returnValue != (ExprBase *)0x0)) {
          pAVar3 = ctx->ctx->allocator;
          iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
          pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar6);
          pSVar4 = (expression->super_ExprBase).source;
          pTVar5 = ctx->ctx->typeVoid;
          pEVar8->typeID = 2;
          pEVar8->source = pSVar4;
          pEVar8->type = pTVar5;
          pEVar8->next = (ExprBase *)0x0;
          pEVar8->listed = false;
          pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
          pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
          break;
        }
        expression_00 = expression_00->next;
        bVar9 = expression_00 == (ExprBase *)0x0;
      } while (!bVar9);
    }
    if (!bVar9) {
      return pEVar8;
    }
    if ((expression->closures == (ExprBase *)0x0) ||
       (pEVar8 = Evaluate(ctx,expression->closures), pEVar8 != (ExprBase *)0x0)) {
      pAVar3 = ctx->ctx->allocator;
      iVar6 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar6);
      pSVar4 = (expression->super_ExprBase).source;
      pTVar5 = ctx->ctx->typeVoid;
      pEVar8->typeID = 2;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar5;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6b40;
      pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
      return pEVar8;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateBlock(ExpressionEvalContext &ctx, ExprBlock *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		if(frame->continueDepth || frame->breakDepth || frame->returnValue)
			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}